

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u32 pager_cksum(Pager *pPager,u8 *aData)

{
  u32 uVar1;
  uint uVar2;
  
  uVar1 = pPager->cksumInit;
  uVar2 = (uint)pPager->pageSize;
  while( true ) {
    uVar2 = uVar2 - 200;
    if ((int)uVar2 < 1) break;
    uVar1 = uVar1 + aData[uVar2 & 0x7fffffff];
  }
  return uVar1;
}

Assistant:

static u32 pager_cksum(Pager *pPager, const u8 *aData){
  u32 cksum = pPager->cksumInit;         /* Checksum value to return */
  int i = pPager->pageSize-200;          /* Loop counter */
  while( i>0 ){
    cksum += aData[i];
    i -= 200;
  }
  return cksum;
}